

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-util.c
# Opt level: O0

char * borg_trim(char *line)

{
  byte *pbVar1;
  ushort **ppuVar2;
  size_t sVar3;
  bool bVar4;
  byte *local_20;
  char *end;
  char *line_local;
  
  end = line;
  while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)*end] & 0x2000) != 0) {
    end = end + 1;
  }
  if (*end != '\0') {
    sVar3 = strlen(end);
    local_20 = (byte *)(end + sVar3);
    do {
      pbVar1 = local_20;
      local_20 = pbVar1 + -1;
      bVar4 = false;
      if (end < local_20) {
        ppuVar2 = __ctype_b_loc();
        bVar4 = ((*ppuVar2)[(int)(uint)*local_20] & 0x2000) != 0;
      }
    } while (bVar4);
    *pbVar1 = 0;
  }
  return end;
}

Assistant:

char *borg_trim(char *line)
{
    /* Trim leading space */
    while (isspace((unsigned char)*line))
        line++;

    /* All spaces */
    if (*line == 0)
        return line;

    /* Trim trailing spaces */
    char *end = line + strlen(line) - 1;
    while (end > line && isspace((unsigned char)*end))
        end--;

    /* Write new null terminator character */
    end[1] = '\0';

    return line;
}